

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsItemPrivate::effectiveBoundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemPrivate *this,QRectF *rect)

{
  QGraphicsEffect *this_00;
  QGraphicsItem *this_01;
  long lVar1;
  long lVar2;
  qreal qVar3;
  qreal qVar4;
  qreal qVar5;
  QRect QVar6;
  QGraphicsView **ppQVar7;
  bool bVar8;
  long lVar9;
  long in_FS_OFFSET;
  QRectF local_108;
  undefined1 local_e8 [16];
  QRectF local_d8;
  QList<QGraphicsView_*> local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->graphicsEffect;
  if (this_00 != (QGraphicsEffect *)0x0 && this->scene != (QGraphicsScene *)0x0) {
    this_01 = this->q_ptr;
    bVar8 = QGraphicsEffect::isEnabled(this_00);
    QVar6.x2.m_i = local_e8._8_4_;
    QVar6.y2.m_i = local_e8._12_4_;
    QVar6.x1.m_i = local_e8._0_4_;
    QVar6.y1.m_i = local_e8._4_4_;
    if (bVar8) {
      if (*(long *)(*(long *)&this->scene->field_0x8 + 0x290) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)this_00 + 0x60))(__return_storage_ptr__,this_00,rect);
          return __return_storage_ptr__;
        }
      }
      else {
        local_78.w._0_4_ = 0xffffffff;
        local_78.w._4_4_ = 0xffffffff;
        local_78.h._0_4_ = 0xffffffff;
        local_78.h._4_4_ = 0xffffffff;
        local_78.xp._0_4_ = 0xffffffff;
        local_78.xp._4_4_ = 0xffffffff;
        local_78.yp._0_4_ = 0xffffffff;
        local_78.yp._4_4_ = 0xffffffff;
        QGraphicsItem::mapRectToScene(&local_78,this_01,rect);
        local_98 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        QGraphicsScene::views(&local_b8,(QGraphicsScene *)this->scene);
        ppQVar7 = local_b8.d.ptr;
        if ((undefined1 *)local_b8.d.size != (undefined1 *)0x0) {
          lVar1 = local_b8.d.size << 3;
          lVar9 = 0;
          do {
            lVar2 = *(long *)((long)ppQVar7 + lVar9);
            local_d8.w._0_4_ = 0xffffffff;
            local_d8.w._4_4_ = 0xffffffff;
            local_d8.h._0_4_ = 0xffffffff;
            local_d8.h._4_4_ = 0xffffffff;
            local_d8.xp._0_4_ = 0xffffffff;
            local_d8.xp._4_4_ = 0xffffffff;
            local_d8.yp._0_4_ = 0xffffffff;
            local_d8.yp._4_4_ = 0xffffffff;
            QGraphicsViewPrivate::mapRectFromScene
                      (&local_d8,*(QGraphicsViewPrivate **)(lVar2 + 8),&local_78);
            local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            (**(code **)(*(long *)this_00 + 0x60))(&local_58,this_00,&local_d8);
            local_e8 = QRectF::toAlignedRect();
            QGraphicsViewPrivate::mapRectToScene
                      (&local_108,*(QGraphicsViewPrivate **)(lVar2 + 8),(QRect *)local_e8);
            QRectF::operator|(&local_58,(QRectF *)local_98);
            local_88._8_8_ = local_58.h;
            local_88._0_8_ = local_58.w;
            local_98._8_8_ = local_58.yp;
            local_98._0_8_ = local_58.xp;
            lVar9 = lVar9 + 8;
          } while (lVar1 != lVar9);
        }
        QGraphicsItem::mapRectFromScene(__return_storage_ptr__,this_01,(QRectF *)local_98);
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,8,0x10);
          }
        }
        QVar6 = (QRect)local_e8;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
      }
      goto LAB_005e9c00;
    }
  }
  QVar6.x2.m_i = local_e8._8_4_;
  QVar6.y2.m_i = local_e8._12_4_;
  QVar6.x1.m_i = local_e8._0_4_;
  QVar6.y1.m_i = local_e8._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qVar3 = rect->xp;
    qVar4 = rect->yp;
    qVar5 = rect->h;
    __return_storage_ptr__->w = rect->w;
    __return_storage_ptr__->h = qVar5;
    __return_storage_ptr__->xp = qVar3;
    __return_storage_ptr__->yp = qVar4;
    return __return_storage_ptr__;
  }
LAB_005e9c00:
  local_e8 = (undefined1  [16])QVar6;
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsItemPrivate::effectiveBoundingRect(const QRectF &rect) const
{
#if QT_CONFIG(graphicseffect)
    Q_Q(const QGraphicsItem);
    QGraphicsEffect *effect = graphicsEffect;
    if (scene && effect && effect->isEnabled()) {
        if (scene->d_func()->views.isEmpty())
            return effect->boundingRectFor(rect);
        QRectF sceneRect = q->mapRectToScene(rect);
        QRectF sceneEffectRect;
        const auto views = scene->views();
        for (QGraphicsView *view : views) {
            QRectF deviceRect = view->d_func()->mapRectFromScene(sceneRect);
            QRect deviceEffectRect = effect->boundingRectFor(deviceRect).toAlignedRect();
            sceneEffectRect |= view->d_func()->mapRectToScene(deviceEffectRect);
        }
        return q->mapRectFromScene(sceneEffectRect);
    }
#endif // QT_CONFIG(graphicseffect)
    return rect;
}